

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O0

xr_surface * __thiscall xray_re::xr_object::attach(xr_object *this,xr_raw_surface *raw_surface)

{
  int iVar1;
  mapped_type *__x;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type local_30;
  xr_surface **surface;
  xr_raw_surface *raw_surface_local;
  xr_object *this_local;
  
  __x = std::
        unordered_map<xray_re::xr_raw_surface,_xray_re::xr_surface_*,_std::hash<xray_re::xr_raw_surface>,_std::equal_to<xray_re::xr_raw_surface>,_std::allocator<std::pair<const_xray_re::xr_raw_surface,_xray_re::xr_surface_*>_>_>
        ::operator[](&this->m_raw_surfaces,raw_surface);
  if (*__x == (mapped_type)0x0) {
    if (this->m_surface_factory == (xr_surface_factory *)0x0) {
      iVar1 = (*(this->super_xr_surface_factory)._vptr_xr_surface_factory[2])(this,raw_surface);
      local_30 = (mapped_type)CONCAT44(extraout_var_00,iVar1);
    }
    else {
      iVar1 = (*this->m_surface_factory->_vptr_xr_surface_factory[2])
                        (this->m_surface_factory,raw_surface);
      local_30 = (mapped_type)CONCAT44(extraout_var,iVar1);
    }
    *__x = local_30;
    if (*__x == (mapped_type)0x0) {
      __assert_fail("surface",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_object.cxx"
                    ,0x1b3,"xr_surface *xray_re::xr_object::attach(const xr_raw_surface &)");
    }
    std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>::push_back
              (&this->m_surfaces,__x);
  }
  return *__x;
}

Assistant:

xr_surface* xr_object::attach(const xr_raw_surface& raw_surface)
{
	xr_surface*& surface = m_raw_surfaces[raw_surface];
	if (surface == 0) {
		surface = m_surface_factory ?
				m_surface_factory->create_surface(raw_surface) :
				create_surface(raw_surface);
		xr_assert(surface);
		m_surfaces.push_back(surface);
	}
	return surface;
}